

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_timedwait.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *format;
  float fVar6;
  undefined4 in_XMM2_Db;
  ALLEGRO_EVENT event;
  ALLEGRO_TIMEOUT timeout;
  float local_74;
  int local_70 [8];
  int local_50;
  undefined1 local_28 [16];
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    lVar3 = al_create_display(0x280,0x1e0);
    if (lVar3 != 0) {
      uVar4 = al_create_event_queue();
      uVar5 = al_get_keyboard_event_source();
      al_register_event_source(uVar4,uVar5);
      local_74 = 0.1;
      do {
        cVar1 = al_wait_for_event_timed(0x3dcccccd,uVar4,local_70);
        if (cVar1 == '\0') {
          local_74 = local_74 + 0.1;
          if (1.0 < local_74) {
            local_74 = 1.0;
            in_XMM2_Db = 0;
          }
        }
        else {
          in_XMM2_Db = 0;
          if (local_70[0] == 10) {
            local_74 = 0.1;
            in_XMM2_Db = 0;
            if (local_50 == 0x3b) {
              local_74 = 0.1;
              do {
                al_init_timeout(0x3fb999999999999a,local_28);
                fVar6 = local_74 + 0.1;
                while (cVar1 = al_wait_for_event_until(uVar4,local_70,local_28), cVar1 != '\0') {
                  if ((local_70[0] == 10) && (fVar6 = 0.2, local_50 == 0x3b)) {
                    return 0;
                  }
                }
                local_74 = 1.0;
                if (fVar6 <= 1.0) {
                  local_74 = fVar6;
                }
                al_map_rgba_f(local_74,local_74 * 0.5,local_74 * 0.25,0);
                al_clear_to_color();
                al_flip_display();
              } while( true );
            }
          }
        }
        al_map_rgba_f(CONCAT44(in_XMM2_Db,local_74 * 0.5),local_74 * 0.25,local_74,0);
        al_clear_to_color();
        al_flip_display();
      } while( true );
    }
    format = "Unable to set any graphic mode\n";
  }
  abort_example(format);
  iVar2 = __cxa_atexit();
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *dpy;
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();

   dpy = al_create_display(640, 480);
   if (!dpy) {
      abort_example("Unable to set any graphic mode\n");
   }

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   test_relative_timeout(queue);
   test_absolute_timeout(queue);

   return 0;
}